

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937sampler.hpp
# Opt level: O2

vec3f __thiscall MT19937Sampler::sampleUnitSphereSurface(MT19937Sampler *this)

{
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  float extraout_XMM0_Da_01;
  float fVar1;
  float fVar2;
  vec3f vVar3;
  vec3f local_38;
  float local_28;
  float local_18;
  
  do {
    do {
      (**(this->super_Sampler)._vptr_Sampler)(this);
      local_18 = extraout_XMM0_Da;
      (**(this->super_Sampler)._vptr_Sampler)(this);
      local_28 = extraout_XMM0_Da_00;
      (**(this->super_Sampler)._vptr_Sampler)(this);
      local_38.z = extraout_XMM0_Da_01 + extraout_XMM0_Da_01 + -1.0;
      fVar1 = local_18 + local_18 + -1.0;
      fVar2 = local_28 + local_28 + -1.0;
      local_38.y = fVar2;
      local_38.x = fVar1;
      fVar1 = SQRT(local_38.z * local_38.z + fVar1 * fVar1 + fVar2 * fVar2);
    } while (1.0 < fVar1);
  } while (fVar1 < 0.001);
  vVar3 = normalized(&local_38);
  return vVar3;
}

Assistant:

vec3f sampleUnitSphereSurface() {
		// TODO optimize
		vec3f v;
		do v = vec3f(get1f()*2-1, get1f()*2-1, get1f()*2-1);
		while (norm(v)>1 || norm(v)<1e-3);
		return normalized(v);
	}